

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_layout.h
# Opt level: O1

void __thiscall upb::generator::DefPoolPair::~DefPoolPair(DefPoolPair *this)

{
  if ((this->pool64_).ptr_._M_t.super___uniq_ptr_impl<upb_DefPool,_void_(*)(upb_DefPool_*)>._M_t.
      super__Tuple_impl<0UL,_upb_DefPool_*,_void_(*)(upb_DefPool_*)>.
      super__Head_base<0UL,_upb_DefPool_*,_false>._M_head_impl != (upb_DefPool *)0x0) {
    (*(_func_void_upb_DefPool_ptr *)
      (this->pool64_).ptr_._M_t.super___uniq_ptr_impl<upb_DefPool,_void_(*)(upb_DefPool_*)>._M_t.
      super__Tuple_impl<0UL,_upb_DefPool_*,_void_(*)(upb_DefPool_*)>.
      super__Tuple_impl<1UL,_void_(*)(upb_DefPool_*)>.
      super__Head_base<1UL,_void_(*)(upb_DefPool_*),_false>)();
  }
  (this->pool64_).ptr_._M_t.super___uniq_ptr_impl<upb_DefPool,_void_(*)(upb_DefPool_*)>._M_t.
  super__Tuple_impl<0UL,_upb_DefPool_*,_void_(*)(upb_DefPool_*)>.
  super__Head_base<0UL,_upb_DefPool_*,_false>._M_head_impl = (upb_DefPool *)0x0;
  if ((this->pool32_).ptr_._M_t.super___uniq_ptr_impl<upb_DefPool,_void_(*)(upb_DefPool_*)>._M_t.
      super__Tuple_impl<0UL,_upb_DefPool_*,_void_(*)(upb_DefPool_*)>.
      super__Head_base<0UL,_upb_DefPool_*,_false>._M_head_impl != (upb_DefPool *)0x0) {
    (**(code **)&(this->pool32_).ptr_._M_t.
                 super___uniq_ptr_impl<upb_DefPool,_void_(*)(upb_DefPool_*)>._M_t.
                 super__Tuple_impl<0UL,_upb_DefPool_*,_void_(*)(upb_DefPool_*)>.
                 super__Tuple_impl<1UL,_void_(*)(upb_DefPool_*)>)();
  }
  (this->pool32_).ptr_._M_t.super___uniq_ptr_impl<upb_DefPool,_void_(*)(upb_DefPool_*)>._M_t.
  super__Tuple_impl<0UL,_upb_DefPool_*,_void_(*)(upb_DefPool_*)>.
  super__Head_base<0UL,_upb_DefPool_*,_false>._M_head_impl = (upb_DefPool *)0x0;
  return;
}

Assistant:

DefPoolPair() {
    pool32_._SetPlatform(kUpb_MiniTablePlatform_32Bit);
    pool64_._SetPlatform(kUpb_MiniTablePlatform_64Bit);
  }